

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringToFile.cpp
# Opt level: O2

ComparisonStatusFlags __thiscall
Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::StringToFile>::operator()
          (Comparator<Corrade::TestSuite::Compare::StringToFile> *this,StringView actualContents,
          StringView filename)

{
  char cVar1;
  State *pSVar2;
  UnderlyingType UVar3;
  String local_78;
  Optional<Corrade::Containers::String> expectedContents;
  undefined8 local_40;
  
  pSVar2 = Containers::
           Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::StringToFile>::State>
           ::operator->(&this->_state);
  (pSVar2->filename)._data = filename._data;
  (pSVar2->filename)._sizePlusFlags = filename._sizePlusFlags;
  pSVar2 = Containers::
           Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::StringToFile>::State>
           ::operator->(&this->_state);
  (pSVar2->actualContents)._data = actualContents._data;
  (pSVar2->actualContents)._sizePlusFlags = actualContents._sizePlusFlags;
  Corrade::Utility::Path::readString(&expectedContents,filename._data,filename._sizePlusFlags);
  UVar3 = '\x11';
  if (expectedContents._set != false) {
    Containers::Optional<Corrade::Containers::String>::operator*(&local_78,&expectedContents);
    pSVar2 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::StringToFile>::State>
             ::operator->(&this->_state);
    Corrade::Containers::String::operator=(&pSVar2->expectedContents,&local_78);
    Corrade::Containers::String::~String(&local_78);
    pSVar2 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::StringToFile>::State>
             ::operator->(&this->_state);
    pSVar2->result = Success;
    Containers::
    Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::StringToFile>::State>::
    operator->(&this->_state);
    Corrade::Containers::BasicStringView<char_const>::BasicStringView
              ((String *)&stack0xffffffffffffffc0);
    cVar1 = Corrade::Containers::operator==
                      (actualContents._data,actualContents._sizePlusFlags,local_40);
    UVar3 = '\x11';
    if (cVar1 != '\0') {
      UVar3 = '\0';
    }
  }
  Containers::Optional<Corrade::Containers::String>::~Optional(&expectedContents);
  return (ComparisonStatusFlags)UVar3;
}

Assistant:

ComparisonStatusFlags Comparator<Compare::StringToFile>::operator()(const Containers::StringView actualContents, const Containers::StringView filename) {
    _state->filename = filename;

    /* Save the actual file contents before the expected so if the expected
       file can't be read, we can still save actual file contents */
    _state->actualContents = actualContents;

    /* If this fails, we already have the actual contents so we can save them */
    Containers::Optional<Containers::String> expectedContents = Utility::Path::readString(filename);
    if(!expectedContents)
        return ComparisonStatusFlag::Diagnostic|ComparisonStatusFlag::Failed;

    _state->expectedContents = *Utility::move(expectedContents);
    _state->result = Result::Success;

    return actualContents == _state->expectedContents ? ComparisonStatusFlags{} :
        ComparisonStatusFlag::Diagnostic|ComparisonStatusFlag::Failed;
}